

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  size_type sVar3;
  bool bVar4;
  bool generalOptimization;
  int iVar5;
  undefined4 extraout_var;
  undefined7 uVar6;
  undefined4 extraout_var_00;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  int extraout_EDX;
  uint allocrule;
  undefined8 uVar7;
  allocator local_2f9;
  int local_2f8;
  int local_2f4;
  undefined8 local_2f0;
  undefined8 local_2e8;
  undefined8 local_2e0;
  undefined8 local_2d8;
  undefined8 local_2d0;
  string local_2c8;
  string local_2a8;
  string inputpath;
  string local_268;
  string local_248;
  sigaction sa;
  fmcalc fc;
  
  progname = *argv;
  inputpath._M_dataplus._M_p = (pointer)&inputpath.field_2;
  inputpath._M_string_length = 0;
  inputpath.field_2._M_local_buf[0] = '\0';
  local_2f8 = -1;
  local_2d0 = 0;
  local_2f0 = 0;
  local_2e0 = 0;
  local_2d8 = 0;
  local_2e8 = 0;
  local_2f4 = argc;
  bVar4 = true;
  do {
    while( true ) {
      generalOptimization = bVar4;
      iVar5 = getopt(argc,argv,"SdnovhOM:p:a:");
      sVar3 = inputpath._M_string_length;
      pcVar2 = _optarg;
      uVar6 = (undefined7)(CONCAT44(extraout_var,iVar5) >> 8);
      bVar4 = generalOptimization;
      if (99 < iVar5) break;
      if (iVar5 < 0x53) {
        if (iVar5 == 0x4d) {
          local_2f8 = atoi(_optarg);
        }
        else {
          if (iVar5 != 0x4f) {
            if (iVar5 == -1) {
              memset(&sa,0,0x98);
              argv = (char **)&sa.sa_mask;
              sigemptyset((sigset_t *)argv);
              sa.__sigaction_handler.sa_handler = segfault_sigaction;
              sa.sa_flags = 4;
              sigaction(0xb,(sigaction *)&sa,(sigaction *)0x0);
              allocrule = (uint)local_2d0;
              if (allocrule < 4) {
                local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"");
                local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"");
                initstreams(&local_248,&local_268);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_268._M_dataplus._M_p != &local_268.field_2) {
                  operator_delete(local_268._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_248._M_dataplus._M_p != &local_248.field_2) {
                  operator_delete(local_248._M_dataplus._M_p);
                }
                fmcalc::fmcalc(&fc,local_2f8,allocrule,&inputpath,(bool)((byte)local_2d8 & 1),
                               (bool)((byte)local_2f0 & 1),(bool)((byte)local_2e0 & 1),
                               generalOptimization,(bool)((byte)local_2e8 & 1));
                std::__cxx11::string::string((string *)&local_2a8,progname,&local_2f9);
                paVar1 = &local_2c8.field_2;
                local_2c8._M_dataplus._M_p = (pointer)paVar1;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"INFO","");
                logprintf(&local_2a8,&local_2c8,"starting process..\n");
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2c8._M_dataplus._M_p != paVar1) {
                  operator_delete(local_2c8._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
                  operator_delete(local_2a8._M_dataplus._M_p);
                }
                fmcalc::doit(&fc);
                std::__cxx11::string::string((string *)&local_2a8,progname,&local_2f9);
                local_2c8._M_dataplus._M_p = (pointer)paVar1;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"INFO","");
                logprintf(&local_2a8,&local_2c8,"finishing process..\n");
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2c8._M_dataplus._M_p != paVar1) {
                  operator_delete(local_2c8._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
                  operator_delete(local_2a8._M_dataplus._M_p);
                }
                fmcalc::~fmcalc(&fc);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)inputpath._M_dataplus._M_p != &inputpath.field_2) {
                  operator_delete(inputpath._M_dataplus._M_p);
                }
                return 0;
              }
              goto LAB_0010aa69;
            }
            goto switchD_0010a73b_caseD_71;
          }
          local_2e0 = CONCAT71(uVar6,1);
        }
      }
      else if (iVar5 == 0x53) {
        local_2e8 = CONCAT71(uVar6,1);
      }
      else {
        if (iVar5 != 0x61) goto switchD_0010a73b_caseD_71;
        iVar5 = atoi(_optarg);
        local_2d0 = CONCAT44(extraout_var_00,iVar5);
      }
    }
    bVar4 = false;
    switch(iVar5) {
    case 0x6e:
      local_2d8 = 1;
      bVar4 = generalOptimization;
      break;
    case 0x6f:
      break;
    case 0x70:
      strlen(_optarg);
      argc = local_2f4;
      std::__cxx11::string::_M_replace((ulong)&inputpath,0,(char *)sVar3,(ulong)pcVar2);
      bVar4 = generalOptimization;
      break;
    case 0x71:
    case 0x72:
    case 0x73:
    case 0x74:
    case 0x75:
switchD_0010a73b_caseD_71:
      main_cold_5();
switchD_0010a73b_caseD_76:
      main_cold_2();
LAB_0010aa69:
      main_cold_4();
      if ((char **)local_2c8._M_dataplus._M_p != argv) {
        operator_delete(local_2c8._M_dataplus._M_p);
      }
      if (local_2a8._M_dataplus._M_p != "SdnovhOM:p:a:") {
        operator_delete(local_2a8._M_dataplus._M_p);
      }
      fmcalc::~fmcalc(&fc);
      uVar7 = extraout_RAX;
      if (extraout_EDX == 1) {
        main_cold_3();
        uVar7 = extraout_RAX_00;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)inputpath._M_dataplus._M_p != &inputpath.field_2) {
        operator_delete(inputpath._M_dataplus._M_p);
      }
      _Unwind_Resume(uVar7);
    case 0x76:
      goto switchD_0010a73b_caseD_76;
    default:
      if (iVar5 != 100) {
        if (iVar5 == 0x68) {
          main_cold_1();
        }
        goto switchD_0010a73b_caseD_71;
      }
      local_2f0 = CONCAT71(uVar6,1);
      bVar4 = generalOptimization;
    }
  } while( true );
}

Assistant:

int main(int argc, char* argv[])
{
	progname = argv[0];
    int new_max = -1;
	int allocrule = 0;
	int opt;
	std::string inputpath;
	bool debug = false;
	bool allocruleOptimizationOff = false;
	bool generalOptimization = true;

	bool netvalue = false;
	bool stepped = false;
    while ((opt = getopt(argc, argv, "SdnovhOM:p:a:")) != -1) {
        switch (opt) {
		case 'o':
			generalOptimization = false;
			break;
		case 'O':
			allocruleOptimizationOff = true;
			break;
		case 'd':
			debug = true;
			break;
         case 'M':
            new_max = atoi(optarg);
            break;
		 case 'a':
			 allocrule = atoi(optarg);
			 break;
		 case 'v':
			 fprintf(stderr, "%s : version: %s\n", argv[0], VERSION);
			 exit(EXIT_FAILURE);
			 break;
		 case 'p':
			 inputpath = optarg;
			 break;
		 case 'n':
			 netvalue = true;
			 break;
		 case 'S':
			 stepped = true;
			 break;
        case 'h':
           help();
           exit(EXIT_FAILURE);
        default:
            help();
            exit(EXIT_FAILURE);
        }
    }

#if !defined(_MSC_VER) && !defined(__MINGW32__)
	struct sigaction sa;

	memset(&sa, 0, sizeof(struct sigaction));
	sigemptyset(&sa.sa_mask);
	sa.sa_sigaction = segfault_sigaction;
	sa.sa_flags = SA_SIGINFO;

	sigaction(SIGSEGV, &sa, NULL);
#endif

	if (allocrule < 0 || allocrule > 3) {
		fprintf(stderr, "FATAL:%s: Invalid allocrule %d\n", progname,allocrule);
		exit(EXIT_FAILURE);
	}

	try {
		initstreams("", "");
		fmcalc fc(new_max, allocrule, inputpath, netvalue,debug, allocruleOptimizationOff, generalOptimization,stepped);
        logprintf(progname, "INFO", "starting process..\n");
		fc.doit();
        logprintf(progname, "INFO", "finishing process..\n");
	}
	catch (const std::bad_alloc &a) {
		fprintf(stderr, "FATAL:%s: bad_alloc: %s\n", progname, a.what());
		exit(EXIT_FAILURE);
	}

	return EXIT_SUCCESS;
}